

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString StringFromMaskedBits(unsigned_long value,unsigned_long mask,size_t byteCount)

{
  ulong in_RCX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar1;
  ulong uVar2;
  char *rhs;
  long lVar3;
  long lVar4;
  SimpleString SVar5;
  
  *(undefined8 *)value = 0;
  *(undefined8 *)(value + 8) = 0;
  SimpleString::copyBufferToNewInternalBuffer((SimpleString *)value,"");
  lVar4 = 0x40;
  if (in_RCX < 9) {
    lVar4 = in_RCX * 8;
  }
  uVar2 = 1L << ((char)lVar4 - 1U & 0x3f);
  sVar1 = extraout_RDX;
  if (lVar4 != 0) {
    lVar3 = 0;
    do {
      rhs = "1";
      if ((mask & uVar2) == 0) {
        rhs = "0";
      }
      if ((byteCount & uVar2) == 0) {
        rhs = "x";
      }
      SimpleString::operator+=((SimpleString *)value,rhs);
      sVar1 = extraout_RDX_00;
      if (lVar4 + -1 != lVar3 && (~(uint)lVar3 & 7) == 0) {
        SimpleString::operator+=((SimpleString *)value," ");
        sVar1 = extraout_RDX_01;
      }
      mask = mask * 2;
      byteCount = byteCount * 2;
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  SVar5.bufferSize_ = sVar1;
  SVar5.buffer_ = (char *)value;
  return SVar5;
}

Assistant:

SimpleString StringFromMaskedBits(unsigned long value, unsigned long mask, size_t byteCount)
{
    SimpleString result;
    size_t bitCount = (byteCount > sizeof(unsigned long)) ? (sizeof(unsigned long) * CPPUTEST_CHAR_BIT) : (byteCount * CPPUTEST_CHAR_BIT);
    const unsigned long msbMask = (((unsigned long) 1) << (bitCount - 1));

    for (size_t i = 0; i < bitCount; i++) {
        if (mask & msbMask) {
            result += (value & msbMask) ? "1" : "0";
        }
        else {
            result += "x";
        }

        if (((i % 8) == 7) && (i != (bitCount - 1))) {
            result += " ";
        }

        value <<= 1;
        mask <<= 1;
    }

    return result;
}